

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void JX9_DATE_Const(jx9_value *pVal,void *pUnused)

{
  tm *ptVar1;
  time_t t;
  time_t tStack_18;
  
  time(&tStack_18);
  ptVar1 = gmtime(&tStack_18);
  jx9_value_string_format
            (pVal,"%04d-%02d-%02d",(ulong)(ptVar1->tm_year + 0x76c),(ulong)(ptVar1->tm_mon + 1),
             (ulong)(uint)ptVar1->tm_mday);
  return;
}

Assistant:

static void JX9_DATE_Const(jx9_value *pVal, void *pUnused)
{
	Sytm sTm;
#ifdef __WINNT__
	SYSTEMTIME sOS;
	GetSystemTime(&sOS);
	SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
	struct tm *pTm;
	time_t t;
	time(&t);
	pTm = gmtime(&t);
	STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	SXUNUSED(pUnused); /* cc warning */
	/* Expand */
	jx9_value_string_format(pVal, "%04d-%02d-%02d", sTm.tm_year, sTm.tm_mon+1, sTm.tm_mday);
}